

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * compute_vla_size(C_Parser *parser,C_Type *ty,C_Token *tok)

{
  C_Type *pCVar1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Obj *var;
  C_Node *pCVar5;
  C_Node *pCVar6;
  
  pCVar2 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar2->kind = ND_NULL_EXPR;
  pCVar2->tok = tok;
  pCVar4 = pCVar2;
  if (ty->base != (C_Type *)0x0) {
    pCVar3 = compute_vla_size(parser,ty->base,tok);
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_COMMA;
    pCVar4->tok = tok;
    pCVar4->lhs = pCVar2;
    pCVar4->rhs = pCVar3;
  }
  pCVar2 = pCVar4;
  if (ty->kind == TY_VLA) {
    pCVar1 = ty->base;
    if (pCVar1->kind == TY_VLA) {
      pCVar2 = new_var_node(parser,pCVar1->vla_size,tok);
    }
    else {
      pCVar2 = new_num(parser,(long)pCVar1->size,tok);
    }
    var = new_lvar(parser,"",C_ty_ulong);
    ty->vla_size = var;
    pCVar5 = new_var_node(parser,var,tok);
    pCVar3 = ty->vla_len;
    pCVar6 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar6->kind = ND_MUL;
    pCVar6->tok = tok;
    pCVar6->lhs = pCVar3;
    pCVar6->rhs = pCVar2;
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_ASSIGN;
    pCVar3->tok = tok;
    pCVar3->lhs = pCVar5;
    pCVar3->rhs = pCVar6;
    pCVar2 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar2->kind = ND_COMMA;
    pCVar2->tok = tok;
    pCVar2->lhs = pCVar4;
    pCVar2->rhs = pCVar3;
  }
  return pCVar2;
}

Assistant:

static C_Node *compute_vla_size(C_Parser *parser, C_Type *ty, C_Token *tok) {
  C_Node *node = new_node(parser, ND_NULL_EXPR, tok);
  if (ty->base)
    node = new_binary(parser, ND_COMMA, node, compute_vla_size(parser, ty->base, tok), tok);

  if (ty->kind != TY_VLA)
    return node;

  C_Node *base_sz;
  if (ty->base->kind == TY_VLA)
    base_sz = new_var_node(parser, ty->base->vla_size, tok);
  else
    base_sz = new_num(parser, ty->base->size, tok);

  ty->vla_size = new_lvar(parser, "", C_ty_ulong);
  C_Node *expr = new_binary(parser, ND_ASSIGN, new_var_node(parser, ty->vla_size, tok),
                          new_binary(parser, ND_MUL, ty->vla_len, base_sz, tok),
                          tok);
  return new_binary(parser, ND_COMMA, node, expr, tok);
}